

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

void failure_finish(void *extra)

{
  uint uVar1;
  char *pcVar2;
  void *extra_local;
  
  if (extra != (void *)0x0) {
    uVar1 = archive_errno((archive *)extra);
    logprintf("    errno: %d\n",(ulong)uVar1);
    pcVar2 = archive_error_string((archive *)extra);
    logprintf("   detail: %s\n",pcVar2);
  }
  if (dump_on_failure != L'\0') {
    fprintf(_stderr," *** forcing core dump so failure can be debugged ***\n");
    abort();
  }
  return;
}

Assistant:

static void
failure_finish(void *extra)
{
	(void)extra; /* UNUSED (maybe) */
#ifdef EXTRA_DUMP
	if (extra != NULL) {
		logprintf("    errno: %d\n", EXTRA_ERRNO(extra));
		logprintf("   detail: %s\n", EXTRA_DUMP(extra));
	}
#endif

	if (dump_on_failure) {
		fprintf(stderr,
		    " *** forcing core dump so failure can be debugged ***\n");
		abort();
	}
}